

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

int ly_set_contains(ly_set *set,void *node)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = 0xffffffff;
  if (set != (ly_set *)0x0) {
    for (uVar2 = 0;
        (uVar1 = 0xffffffff, set->number != uVar2 &&
        (uVar1 = uVar2, (set->set).s[uVar2] != (lys_node *)node)); uVar2 = uVar2 + 1) {
    }
  }
  return uVar1;
}

Assistant:

API int
ly_set_contains(const struct ly_set *set, void *node)
{
    unsigned int i;

    if (!set) {
        return -1;
    }

    for (i = 0; i < set->number; i++) {
        if (set->set.g[i] == node) {
            /* object found */
            return i;
        }
    }

    /* object not found */
    return -1;
}